

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairList.cpp
# Opt level: O0

ostream * OpenMD::operator<<(ostream *o,PairList *e)

{
  bool bVar1;
  ostream *poVar2;
  reference ppVar3;
  ostream *poVar4;
  ostream *in_RDI;
  int index;
  iterator i;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *in_stack_ffffffffffffffb8;
  _Self local_30;
  _Base_ptr local_28;
  int local_1c;
  _Rb_tree_const_iterator<std::pair<int,_int>_> local_18 [2];
  ostream *local_8;
  
  local_8 = in_RDI;
  std::_Rb_tree_const_iterator<std::pair<int,_int>_>::_Rb_tree_const_iterator(local_18);
  local_1c = 0;
  local_28 = (_Base_ptr)
             std::
             set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
             ::begin(in_stack_ffffffffffffffb8);
  local_18[0]._M_node = local_28;
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=(local_18,&local_30);
    if (!bVar1) break;
    poVar2 = std::operator<<(local_8,"pairList[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c);
    poVar2 = std::operator<<(poVar2,"] i, j: ");
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator*
                       ((_Rb_tree_const_iterator<std::pair<int,_int>_> *)0x1f4edb);
    poVar4 = (ostream *)std::ostream::operator<<(poVar2,ppVar3->first);
    poVar4 = std::operator<<(poVar4," - ");
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator*
                       ((_Rb_tree_const_iterator<std::pair<int,_int>_> *)0x1f4f05);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,ppVar3->second);
    std::operator<<(poVar4,"\n");
    local_1c = local_1c + 1;
    std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<int,_int>_> *)poVar2);
  }
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& o, PairList& e) {
    std::set<std::pair<int, int>>::iterator i;

    int index;

    index = 0;

    for (i = e.pairSet_.begin(); i != e.pairSet_.end(); ++i) {
      o << "pairList[" << index << "] i, j: " << (*i).first << " - "
        << (*i).second << "\n";
      index++;
    }

    return o;
  }